

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O0

string * __thiscall
wabt::cat<wabt::string_view,char[4]>
          (string *__return_storage_ptr__,wabt *this,string_view *args,char (*args_1) [4])

{
  char (*args_local_1) [4];
  string_view *args_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cat_compute_size<wabt::string_view,char[4]>((string_view *)this,(char (*) [4])args);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cat_concatenate<wabt::string_view,char[4]>
            (__return_storage_ptr__,(string_view *)this,(char (*) [4])args);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
    std::string s;
    s.reserve(cat_compute_size(args...));
    cat_concatenate(s, args...);
    return s;
}